

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O1

int tokthscan(tokthdef *tab,uint hash,_func_int_void_ptr_toksdef_ptr_mcmon *cb,void *cbctx)

{
  mcmon *pmVar1;
  mcmon objnum;
  mcmcxdef *ctx;
  int iVar2;
  uchar *puVar3;
  mcmon obj;
  uint uVar4;
  mcmon objnum_00;
  
  ctx = tab->tokthmem;
  objnum_00 = tab->tokthhsh[hash].tokthpobj;
  uVar4 = tab->tokthhsh[hash].tokthpofs;
  if (objnum_00 != 0xffff) {
    puVar3 = mcmlck(ctx,objnum_00);
    obj = objnum_00;
    do {
      pmVar1 = (mcmon *)(puVar3 + uVar4);
      objnum = *pmVar1;
      uVar4 = *(uint *)(pmVar1 + 2);
      iVar2 = (*cb)(cbctx,(toksdef *)(pmVar1 + 4),obj);
      if (iVar2 != 0) {
        iVar2 = 1;
        goto LAB_0011805d;
      }
      if (objnum != 0xffff && objnum != objnum_00) {
        mcmunlck(ctx,objnum_00);
        puVar3 = mcmlck(ctx,objnum);
        objnum_00 = objnum;
      }
      obj = objnum;
    } while (objnum != 0xffff);
  }
  iVar2 = 0;
  obj = objnum_00;
  if (objnum_00 != 0xffff) {
LAB_0011805d:
    mcmunlck(ctx,obj);
  }
  return iVar2;
}

Assistant:

static int tokthscan(tokthdef *tab, uint hash,
                     int (*cb)(void *, toksdef *, mcmon), 
                     void *cbctx)
{
    tokshdef  *symh;
    toksdef   *sym;
    tokthpdef  p;
    tokthpdef  nxt;
    uchar     *pg;
    mcmcxdef  *mctx = tab->tokthmem;
    mcmon      curobj;

    /* get first object, and lock its page if there is one */
    OSCPYSTRUCT(p, tab->tokthhsh[hash]);
    if ((curobj = p.tokthpobj) != MCMONINV)
        pg = mcmlck(mctx, curobj);

    /* look for a match using the callback */
    for ( ; p.tokthpobj != MCMONINV ; OSCPYSTRUCT(p, nxt))
    {
        symh = (tokshdef *)(pg + p.tokthpofs);
        sym = &symh->tokshsc;
        OSCPYSTRUCT(nxt, symh->tokshnxt);

        /* check for a match; copy to return buffer if found */
        if ((*cb)(cbctx, sym, p.tokthpobj))
        {
            mcmunlck(mctx, p.tokthpobj);
            return(TRUE);
        }
        
        /* if the next page is different from this one, get new lock */
        if (nxt.tokthpobj != curobj && nxt.tokthpobj != MCMONINV)
        {
            mcmunlck(mctx, curobj);
            curobj = nxt.tokthpobj;
            pg = mcmlck(mctx, curobj);
        }
    }

    /* unlock last object, if we had a lock at all */
    if (curobj != MCMONINV) mcmunlck(mctx, curobj);
    return(FALSE);
}